

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O3

FT_ULong hash_str_lookup(FT_Hashkey *key)

{
  FT_ULong FVar1;
  char *pcVar2;
  char cVar3;
  
  pcVar2 = key->str;
  cVar3 = *pcVar2;
  if (cVar3 != '\0') {
    FVar1 = 0;
    do {
      pcVar2 = pcVar2 + 1;
      FVar1 = (long)cVar3 + FVar1 * 0x1f;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
    return FVar1;
  }
  return 0;
}

Assistant:

static FT_ULong
  hash_str_lookup( FT_Hashkey*  key )
  {
    const char*  kp  = key->str;
    FT_ULong     res = 0;


    /* Mocklisp hash function. */
    while ( *kp )
      res = ( res << 5 ) - res + (FT_ULong)*kp++;

    return res;
  }